

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

ExtensionRange * __thiscall
google::protobuf::Descriptor::FindExtensionRangeContainingNumber(Descriptor *this,int number)

{
  int iVar1;
  ExtensionRange *pEVar2;
  int in_ESI;
  Descriptor *in_RDI;
  int i;
  int local_18;
  
  local_18 = 0;
  while( true ) {
    iVar1 = extension_range_count(in_RDI);
    if (iVar1 <= local_18) {
      return (ExtensionRange *)0x0;
    }
    pEVar2 = extension_range(in_RDI,local_18);
    if ((pEVar2->start <= in_ESI) &&
       (pEVar2 = extension_range(in_RDI,local_18), in_ESI < pEVar2->end)) break;
    local_18 = local_18 + 1;
  }
  pEVar2 = extension_range(in_RDI,local_18);
  return pEVar2;
}

Assistant:

const Descriptor::ExtensionRange*
Descriptor::FindExtensionRangeContainingNumber(int number) const {
  // Linear search should be fine because we don't expect a message to have
  // more than a couple extension ranges.
  for (int i = 0; i < extension_range_count(); i++) {
    if (number >= extension_range(i)->start &&
        number < extension_range(i)->end) {
      return extension_range(i);
    }
  }
  return nullptr;
}